

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O0

void __thiscall FFTAnalyzer::CheckInitialized(FFTAnalyzer *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  float *pfVar10;
  UnityComplexNumber *pUVar11;
  float fVar12;
  int local_14;
  int n;
  FFTAnalyzer *this_local;
  
  if (this->window == (float *)0x0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)this->spectrumSize;
    uVar9 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    pfVar10 = (float *)operator_new__(uVar9);
    this->window = pfVar10;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)this->spectrumSize;
    uVar9 = SUB168(auVar2 * ZEXT816(4),0);
    if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    pfVar10 = (float *)operator_new__(uVar9);
    this->ibuffer = pfVar10;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)this->spectrumSize;
    uVar9 = SUB168(auVar3 * ZEXT816(4),0);
    if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    pfVar10 = (float *)operator_new__(uVar9);
    this->obuffer = pfVar10;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)(this->spectrumSize / 2);
    uVar9 = SUB168(auVar4 * ZEXT816(4),0);
    if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    pfVar10 = (float *)operator_new__(uVar9);
    this->ispec1 = pfVar10;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (long)(this->spectrumSize / 2);
    uVar9 = SUB168(auVar5 * ZEXT816(4),0);
    if (SUB168(auVar5 * ZEXT816(4),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    pfVar10 = (float *)operator_new__(uVar9);
    this->ispec2 = pfVar10;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (long)(this->spectrumSize / 2);
    uVar9 = SUB168(auVar6 * ZEXT816(4),0);
    if (SUB168(auVar6 * ZEXT816(4),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    pfVar10 = (float *)operator_new__(uVar9);
    this->ospec1 = pfVar10;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (long)(this->spectrumSize / 2);
    uVar9 = SUB168(auVar7 * ZEXT816(4),0);
    if (SUB168(auVar7 * ZEXT816(4),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    pfVar10 = (float *)operator_new__(uVar9);
    this->ospec2 = pfVar10;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (long)this->spectrumSize;
    uVar9 = SUB168(auVar8 * ZEXT816(8),0);
    if (SUB168(auVar8 * ZEXT816(8),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    pUVar11 = (UnityComplexNumber *)operator_new__(uVar9);
    this->cspec = pUVar11;
    for (local_14 = 0; local_14 < this->spectrumSize; local_14 = local_14 + 1) {
      fVar12 = cosf((float)local_14 * (3.1415927 / (float)this->spectrumSize));
      this->window[local_14] = fVar12 * -0.46 + 0.54;
    }
    memset(this->ibuffer,0,(long)this->spectrumSize << 2);
    memset(this->obuffer,0,(long)this->spectrumSize << 2);
    memset(this->ispec1,0,(long)(this->spectrumSize / 2) << 2);
    memset(this->ispec2,0,(long)(this->spectrumSize / 2) << 2);
    memset(this->ospec1,0,(long)(this->spectrumSize / 2) << 2);
    memset(this->ospec2,0,(long)(this->spectrumSize / 2) << 2);
    memset(this->cspec,0,(long)this->spectrumSize << 3);
  }
  return;
}

Assistant:

void FFTAnalyzer::CheckInitialized()
{
    if (window == NULL)
    {
        window = new float[spectrumSize];
        ibuffer = new float[spectrumSize];
        obuffer = new float[spectrumSize];
        ispec1 = new float[spectrumSize / 2];
        ispec2 = new float[spectrumSize / 2];
        ospec1 = new float[spectrumSize / 2];
        ospec2 = new float[spectrumSize / 2];
        cspec = new UnityComplexNumber[spectrumSize];
        for (int n = 0; n < spectrumSize; n++)
            window[n] = 0.54f - 0.46f * cosf(n * (kPI / (float)spectrumSize));
        memset(ibuffer, 0, sizeof(float) * spectrumSize);
        memset(obuffer, 0, sizeof(float) * spectrumSize);
        memset(ispec1, 0, sizeof(float) * (spectrumSize / 2));
        memset(ispec2, 0, sizeof(float) * (spectrumSize / 2));
        memset(ospec1, 0, sizeof(float) * (spectrumSize / 2));
        memset(ospec2, 0, sizeof(float) * (spectrumSize / 2));
        memset(cspec, 0, sizeof(UnityComplexNumber) * spectrumSize);
    }
}